

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODRowReader.h
# Opt level: O0

int ZXing::OneD::RowReader::NarrowWideBitPattern(PatternView *view)

{
  bool bVar1;
  value_type vVar2;
  unsigned_short uVar3;
  int iVar4;
  PatternView *in_RDI;
  int i;
  int pattern;
  BarAndSpaceI threshold;
  int local_1c;
  int local_18;
  BarAndSpaceI local_14;
  PatternView *local_10;
  int local_4;
  
  local_10 = in_RDI;
  local_14 = NarrowWideThreshold(view);
  bVar1 = BarAndSpace<unsigned_short>::isValid(&local_14);
  if (bVar1) {
    local_18 = 0;
    for (local_1c = 0; iVar4 = PatternView::size(local_10), local_1c < iVar4;
        local_1c = local_1c + 1) {
      vVar2 = PatternView::operator[](local_10,local_1c);
      uVar3 = BarAndSpace<unsigned_short>::operator[](&local_14,local_1c);
      if ((uint)uVar3 * 2 < (uint)vVar2) {
        return -1;
      }
      vVar2 = PatternView::operator[](local_10,local_1c);
      uVar3 = BarAndSpace<unsigned_short>::operator[](&local_14,local_1c);
      AppendBit<int,void>(&local_18,uVar3 < vVar2);
    }
    local_4 = local_18;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int NarrowWideBitPattern(const PatternView& view)
	{
		const auto threshold = NarrowWideThreshold(view);
		if (!threshold.isValid())
			return -1;

		int pattern = 0;
		for (int i = 0; i < view.size(); ++i) {
			if (view[i] > threshold[i] * 2)
				return -1;
			AppendBit(pattern, view[i] > threshold[i]);
		}

		return pattern;
	}